

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O1

void __thiscall
CombinedH264Demuxer::getTrackList
          (CombinedH264Demuxer *this,
          map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
          *trackList)

{
  mapped_type *pmVar1;
  long *local_48 [2];
  long local_38 [2];
  int64_t local_28;
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
  local_28 = 0;
  pmVar1 = std::
           map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>::
           operator[](trackList,&MVC_STREAM_INDEX);
  pmVar1->m_trackType = 0xe;
  std::__cxx11::string::operator=((string *)&pmVar1->m_lang,(string *)local_48);
  pmVar1->m_delay = local_28;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
  local_28 = 0;
  pmVar1 = std::
           map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>::
           operator[](trackList,&AVC_STREAM_INDEX);
  pmVar1->m_trackType = 1;
  std::__cxx11::string::operator=((string *)&pmVar1->m_lang,(string *)local_48);
  pmVar1->m_delay = local_28;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void CombinedH264Demuxer::getTrackList(std::map<int32_t, TrackInfo>& trackList)
{
    trackList[MVC_STREAM_INDEX] = TrackInfo(CODEC_V_MPEG4_H264_DEP, "", 0);
    trackList[AVC_STREAM_INDEX] = TrackInfo(CODEC_V_MPEG4_H264, "", 0);
}